

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeSetHasContent(BtShared *pBt,Pgno pgno)

{
  u32 uVar1;
  bool bVar2;
  int iVar3;
  Bitvec *__s;
  
  if (pBt->pHasContent == (Bitvec *)0x0) {
    uVar1 = pBt->nPage;
    __s = (Bitvec *)sqlite3Malloc(0x200);
    bVar2 = __s != (Bitvec *)0x0;
    if (__s == (Bitvec *)0x0) {
      iVar3 = 7;
    }
    else {
      iVar3 = 0;
      memset(__s,0,0x200);
      __s->iSize = uVar1;
    }
    pBt->pHasContent = __s;
  }
  else {
    iVar3 = 0;
    bVar2 = true;
  }
  if (bVar2) {
    iVar3 = 0;
    if (pgno <= pBt->pHasContent->iSize) {
      iVar3 = sqlite3BitvecSet(pBt->pHasContent,pgno);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int btreeSetHasContent(BtShared *pBt, Pgno pgno){
  int rc = SQLITE_OK;
  if( !pBt->pHasContent ){
    assert( pgno<=pBt->nPage );
    pBt->pHasContent = sqlite3BitvecCreate(pBt->nPage);
    if( !pBt->pHasContent ){
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  if( rc==SQLITE_OK && pgno<=sqlite3BitvecSize(pBt->pHasContent) ){
    rc = sqlite3BitvecSet(pBt->pHasContent, pgno);
  }
  return rc;
}